

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

void __thiscall
Centaurus::Grammar<char>::print_dfa
          (Grammar<char> *this,wostream *os,ATNPath *path,bool optimize_flag)

{
  ATNPath *os_00;
  ATNNodeType AVar1;
  SimpleException *this_00;
  Identifier *this_01;
  wstring *graph_name;
  undefined1 local_90 [8];
  DFA<char> dfa;
  NFA<char> *nfa;
  allocator local_51;
  string local_50;
  ATNNode<char> *local_30;
  ATNNode<char> *node;
  ATNPath *pAStack_20;
  bool optimize_flag_local;
  ATNPath *path_local;
  wostream *os_local;
  Grammar<char> *this_local;
  
  node._7_1_ = optimize_flag;
  pAStack_20 = path;
  path_local = (ATNPath *)os;
  os_local = (wostream *)this;
  local_30 = resolve(this,path);
  AVar1 = ATNNode<char>::type(local_30);
  if (AVar1 != RegularTerminal) {
    this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"The specified node is not an NFA.",&local_51);
    SimpleException::SimpleException(this_00,&local_50);
    __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
  }
  dfa.super_NFABase<Centaurus::DFAState<char>_>.m_states.
  super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)ATNNode<char>::get_nfa(local_30);
  DFA<char>::DFA((DFA<char> *)local_90,
                 (NFA<char> *)
                 dfa.super_NFABase<Centaurus::DFAState<char>_>.m_states.
                 super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(bool)(node._7_1_ & 1));
  os_00 = path_local;
  this_01 = ATNPath::leaf_id(pAStack_20);
  graph_name = Identifier::str_abi_cxx11_(this_01);
  DFA<char>::print((DFA<char> *)local_90,(wostream *)os_00,graph_name);
  DFA<char>::~DFA((DFA<char> *)local_90);
  return;
}

Assistant:

virtual void print_dfa(std::wostream& os, const ATNPath& path, bool optimize_flag) const override
    {
        const ATNNode<TCHAR>& node = resolve(path);

        if (node.type() != ATNNodeType::RegularTerminal)
        {
            throw SimpleException("The specified node is not an NFA.");
        }
        else
        {
            const NFA<TCHAR>& nfa = node.get_nfa();

            DFA<TCHAR> dfa(nfa, optimize_flag);

            dfa.print(os, path.leaf_id().str());
        }
    }